

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O2

void gl_ParseHardwareShader(FScanner *sc,int deflump)

{
  bool bVar1;
  FTextureID FVar2;
  int iVar3;
  uint uVar4;
  uint i;
  ulong uVar5;
  FTexture *pFVar6;
  long lVar7;
  FString maplumpname;
  float local_34;
  
  maplumpname.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  bVar1 = FScanner::Compare(sc,"texture");
  if (bVar1) {
    iVar3 = 1;
  }
  else {
    bVar1 = FScanner::Compare(sc,"flat");
    if (bVar1) {
      iVar3 = 2;
    }
    else {
      bVar1 = FScanner::Compare(sc,"sprite");
      if (bVar1) {
        iVar3 = 3;
      }
      else {
        iVar3 = 0;
        FScanner::UnGet(sc);
      }
    }
  }
  FScanner::MustGetString(sc);
  FVar2 = FTextureManager::CheckForTexture(&TexMan,sc->String,iVar3,1);
  if ((uint)FVar2.texnum < TexMan.Textures.Count) {
    pFVar6 = TexMan.Textures.Array[FVar2.texnum].Texture;
  }
  else {
    pFVar6 = (FTexture *)0x0;
  }
  FScanner::MustGetToken(sc,0x7b);
  local_34 = 1.0;
  while (bVar1 = FScanner::CheckToken(sc,0x7d), !bVar1) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"shader");
    if (bVar1) {
      FScanner::MustGetString(sc);
      FString::operator=(&maplumpname,sc->String);
    }
    else {
      bVar1 = FScanner::Compare(sc,"speed");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_34 = (float)sc->Float;
      }
    }
  }
  if ((pFVar6 != (FTexture *)0x0) && (*(int *)(maplumpname.Chars + -0xc) != 0)) {
    if ((pFVar6->field_0x31 & 0xc0) == 0) {
      (pFVar6->gl_info).shaderspeed = local_34;
      lVar7 = 0;
      for (uVar5 = 0; uVar5 < usershaders.Count; uVar5 = uVar5 + 1) {
        iVar3 = FString::CompareNoCase
                          ((FString *)((long)&(usershaders.Array)->Chars + lVar7),&maplumpname);
        if (iVar3 == 0) goto LAB_00403af8;
        lVar7 = lVar7 + 8;
      }
      uVar4 = TArray<FString,_FString>::Push(&usershaders,&maplumpname);
      uVar5 = (ulong)uVar4;
LAB_00403af8:
      (pFVar6->gl_info).shaderindex = (int)uVar5 + 0xc;
    }
    else {
      Printf("Cannot combine warping with hardware shader on texture \'%s\'\n",(pFVar6->Name).Chars)
      ;
    }
  }
  FString::~FString(&maplumpname);
  return;
}

Assistant:

void gl_ParseHardwareShader(FScanner &sc, int deflump)
{
	int type = FTexture::TEX_Any;
	bool disable_fullbright=false;
	bool thiswad = false;
	bool iwad = false;
	int maplump = -1;
	FString maplumpname;
	float speed = 1.f;

	sc.MustGetString();
	if (sc.Compare("texture")) type = FTexture::TEX_Wall;
	else if (sc.Compare("flat")) type = FTexture::TEX_Flat;
	else if (sc.Compare("sprite")) type = FTexture::TEX_Sprite;
	else sc.UnGet();

	sc.MustGetString();
	FTextureID no = TexMan.CheckForTexture(sc.String, type);
	FTexture *tex = TexMan[no];

	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		sc.MustGetString();
		if (sc.Compare("shader"))
		{
			sc.MustGetString();
			maplumpname = sc.String;
		}
		else if (sc.Compare("speed"))
		{
			sc.MustGetFloat();
			speed = float(sc.Float);
		}
	}
	if (!tex)
	{
		return;
	}

	if (maplumpname.IsNotEmpty())
	{
		if (tex->bWarped != 0)
		{
			Printf("Cannot combine warping with hardware shader on texture '%s'\n", tex->Name.GetChars());
			return;
		}
		tex->gl_info.shaderspeed = speed; 
		for(unsigned i=0;i<usershaders.Size();i++)
		{
			if (!usershaders[i].CompareNoCase(maplumpname))
			{
				tex->gl_info.shaderindex = i + FIRST_USER_SHADER;
				return;
			}
		}
		tex->gl_info.shaderindex = usershaders.Push(maplumpname) + FIRST_USER_SHADER;
	}	
}